

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::appendData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLCh *dat,XMLSize_t n)

{
  DOMBuffer *this_00;
  long *plVar1;
  long lVar2;
  DOMException *this_01;
  MemoryManager **ppMVar3;
  XMLSize_t XVar4;
  
  if (node == (DOMNode *)0x0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)__dynamic_cast(node,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar1 != (long *)0x0) {
    lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
    if (lVar2 != 0) {
      lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
      if ((*(ushort *)(lVar2 + 0x10) & 1) == 0) {
        this_00 = this->fDataBuf;
        if (this_00->fCapacity <= this_00->fIndex + n) {
          DOMBuffer::expandCapacity(this_00,n,false);
        }
        memcpy(this_00->fBuffer + this_00->fIndex,dat,n * 2);
        XVar4 = n + this_00->fIndex;
        this_00->fIndex = XVar4;
        this_00->fBuffer[XVar4] = L'\0';
        return;
      }
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fDoc == (DOMDocumentImpl *)0x0) {
        ppMVar3 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        ppMVar3 = &this->fDoc->fMemoryManager;
      }
      DOMException::DOMException(this_01,7,0,*ppMVar3);
      goto LAB_00266bef;
    }
  }
  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_00266bef:
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::appendData(const DOMNode *node, const  XMLCh *dat, XMLSize_t n)
{
    if(castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    fDataBuf->append(dat, n);
}